

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftext.c
# Opt level: O0

void iffts(float *data,long M,long Rows)

{
  short *in_RSI;
  float *in_RDI;
  long unaff_retaddr;
  long in_stack_00000008;
  
  iffts1((float *)Rows,in_stack_00000008,unaff_retaddr,in_RDI,in_RSI);
  return;
}

Assistant:

void iffts(float *data, long M, long Rows){
/* Compute in-place inverse complex fft on the rows of the input array	*/
/* INPUTS */
/* *ioptr = input data array	*/
/* M = log2 of fft size	(ex M=10 for 1024 point fft) */
/* Rows = number of rows in ioptr array (use 1 for Rows for a single fft)	*/
/* OUTPUTS */
/* *ioptr = output data array	*/
	iffts1(data, M, Rows, UtblArray[M], BRLowArray[M/2]);
}